

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metadata.cpp
# Opt level: O3

void __thiscall
ASDCP::MXF::GenericStreamTextBasedSet::GenericStreamTextBasedSet
          (GenericStreamTextBasedSet *this,Dictionary *d)

{
  Dictionary *this_00;
  undefined8 uVar1;
  undefined8 uVar2;
  MDDEntry *pMVar3;
  
  TextBasedObject::TextBasedObject(&this->super_TextBasedObject,d);
  (this->super_TextBasedObject).super_DescriptiveObject.super_InterchangeObject.super_KLVPacket.
  _vptr_KLVPacket = (_func_int **)&PTR__TextBasedObject_00224da0;
  this->GenericStreamSID = 0;
  this_00 = (this->super_TextBasedObject).super_DescriptiveObject.super_InterchangeObject.m_Dict;
  if (this_00 != (Dictionary *)0x0) {
    pMVar3 = Dictionary::Type(this_00,MDD_GenericStreamTextBasedSet);
    uVar1 = *(undefined8 *)pMVar3->ul;
    uVar2 = *(undefined8 *)(pMVar3->ul + 8);
    (this->super_TextBasedObject).super_DescriptiveObject.super_InterchangeObject.super_KLVPacket.
    m_UL.super_Identifier<16U>.m_HasValue = true;
    *(undefined8 *)
     (this->super_TextBasedObject).super_DescriptiveObject.super_InterchangeObject.super_KLVPacket.
     m_UL.super_Identifier<16U>.m_Value = uVar1;
    *(undefined8 *)
     ((long)(this->super_TextBasedObject).super_DescriptiveObject.super_InterchangeObject.
            super_KLVPacket.m_UL.super_Identifier<16U>.m_Value + 8) = uVar2;
    return;
  }
  __assert_fail("m_Dict",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/Metadata.cpp"
                ,0x1303,
                "ASDCP::MXF::GenericStreamTextBasedSet::GenericStreamTextBasedSet(const Dictionary *)"
               );
}

Assistant:

GenericStreamTextBasedSet::GenericStreamTextBasedSet(const Dictionary* d) : TextBasedObject(d), GenericStreamSID(0)
{
  assert(m_Dict);
  m_UL = m_Dict->ul(MDD_GenericStreamTextBasedSet);
}